

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O2

Logger * Assimp::DefaultLogger::create(char *name,LogSeverity severity,uint defStreams,IOSystem *io)

{
  undefined *puVar1;
  DefaultLogger *this;
  undefined8 *puVar2;
  LogStream *pLVar3;
  
  if ((undefined8 *)m_pLogger != &s_pNullLogger && m_pLogger != (undefined *)0x0) {
    (**(code **)(*(long *)m_pLogger + 8))();
  }
  this = (DefaultLogger *)Intern::AllocateFromAssimpHeap::operator_new(0x838);
  DefaultLogger(this,severity);
  m_pLogger = (undefined *)this;
  if ((defStreams & 8) != 0) {
    (*(this->super_Logger)._vptr_Logger[2])(this,0,0xf);
  }
  puVar1 = m_pLogger;
  if ((defStreams & 2) != 0) {
    puVar2 = (undefined8 *)Intern::AllocateFromAssimpHeap::operator_new(0x10);
    *puVar2 = &PTR__LogStream_00758188;
    puVar2[1] = &std::cout;
    (**(code **)(*(long *)puVar1 + 0x10))(puVar1,puVar2,0xf);
  }
  puVar1 = m_pLogger;
  if ((defStreams & 4) != 0) {
    puVar2 = (undefined8 *)Intern::AllocateFromAssimpHeap::operator_new(0x10);
    *puVar2 = &PTR__LogStream_00758188;
    puVar2[1] = &std::cerr;
    (**(code **)(*(long *)puVar1 + 0x10))(puVar1,puVar2,0xf);
  }
  puVar1 = m_pLogger;
  if ((name != (char *)0x0 && (defStreams & 1) != 0) && (*name != '\0')) {
    pLVar3 = LogStream::createDefaultStream(aiDefaultLogStream_FILE,name,io);
    (**(code **)(*(long *)puVar1 + 0x10))(puVar1,pLVar3,0xf);
  }
  return (Logger *)m_pLogger;
}

Assistant:

Logger *DefaultLogger::create(const char* name /*= "AssimpLog.txt"*/,
    LogSeverity severity                       /*= NORMAL*/,
    unsigned int defStreams                    /*= aiDefaultLogStream_DEBUGGER | aiDefaultLogStream_FILE*/,
    IOSystem* io                               /*= NULL*/) {
    // enter the mutex here to avoid concurrency problems
#ifndef ASSIMP_BUILD_SINGLETHREADED
    std::lock_guard<std::mutex> lock(loggerMutex);
#endif

    if ( m_pLogger && !isNullLogger() ) {
        delete m_pLogger;
    }

    m_pLogger = new DefaultLogger( severity );

    // Attach default log streams
    // Stream the log to the MSVC debugger?
    if ( defStreams & aiDefaultLogStream_DEBUGGER ) {
        m_pLogger->attachStream( LogStream::createDefaultStream( aiDefaultLogStream_DEBUGGER ) );
    }

    // Stream the log to COUT?
    if ( defStreams & aiDefaultLogStream_STDOUT ) {
        m_pLogger->attachStream( LogStream::createDefaultStream( aiDefaultLogStream_STDOUT ) );
    }

    // Stream the log to CERR?
    if ( defStreams & aiDefaultLogStream_STDERR ) {
        m_pLogger->attachStream( LogStream::createDefaultStream( aiDefaultLogStream_STDERR ) );
    }

    // Stream the log to a file
    if ( defStreams & aiDefaultLogStream_FILE && name && *name ) {
        m_pLogger->attachStream( LogStream::createDefaultStream( aiDefaultLogStream_FILE, name, io ) );
    }

    return m_pLogger;
}